

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Mat6x6d * __thiscall OpenMD::HydroProp::getResistanceTensorAtPos(HydroProp *this,Vector3d *pos)

{
  RectMatrix<double,_3U,_3U> *in_RDX;
  SquareMatrix3<double> *in_RSI;
  Mat6x6d *in_RDI;
  Mat3x3d Xipostr;
  Mat3x3d Xiposrr;
  Mat3x3d Xipostt;
  Mat3x3d Xirr;
  Mat3x3d Xitr;
  Mat3x3d Xitt;
  Mat3x3d U;
  Vector3d cp;
  Mat6x6d *Xipos;
  Mat6x6d *this_00;
  Vector3<double> *v;
  RectMatrix<double,_6U,_6U> *this_01;
  HydroProp *in_stack_fffffffffffff9e8;
  SquareMatrix3<double> *in_stack_fffffffffffff9f0;
  SquareMatrix3<double> *in_stack_fffffffffffff9f8;
  RectMatrix<double,_3U,_3U> local_460;
  RectMatrix<double,_3U,_3U> local_418;
  RectMatrix<double,_3U,_3U> local_3d0 [3];
  RectMatrix<double,_3U,_3U> local_2f8 [9];
  Vector3<double> local_48;
  
  v = &local_48;
  this_00 = in_RDI;
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_RDI);
  this_01 = (RectMatrix<double,_6U,_6U> *)&stack0xffffffffffffffd0;
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_RDX);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3bcdfe);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,(Vector3<double> *)in_RDX);
  SquareMatrix3<double>::setupSkewMat((SquareMatrix3<double> *)this_01,v);
  getXitt(in_stack_fffffffffffff9e8);
  getXitr(in_stack_fffffffffffff9e8);
  getXirr(in_stack_fffffffffffff9e8);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3bce72);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3bce81);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3bce90);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)in_RDI,(SquareMatrix3<double> *)in_RDX);
  OpenMD::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  OpenMD::operator-((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff9e8,
                    (RectMatrix<double,_3U,_3U> *)this_01);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)in_RDI,in_RDX);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)this_00,(SquareMatrix<double,_3> *)in_RDI);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x3bcf22);
  RectMatrix<double,_3U,_3U>::~RectMatrix(local_2f8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bcf3c);
  OpenMD::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  OpenMD::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  OpenMD::operator-((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff9e8,
                    (RectMatrix<double,_3U,_3U> *)this_01);
  OpenMD::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  OpenMD::operator+((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff9e8,
                    (RectMatrix<double,_3U,_3U> *)this_01);
  SquareMatrix3<double>::transpose(in_stack_fffffffffffff9f8);
  OpenMD::operator*(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  OpenMD::operator-((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff9e8,
                    (RectMatrix<double,_3U,_3U> *)this_01);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)in_RDI,in_RDX);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)this_00,(SquareMatrix<double,_3> *)in_RDI);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x3bd067);
  RectMatrix<double,_3U,_3U>::~RectMatrix(local_3d0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd081);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd08e);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_418);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd0a8);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_460);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd0c2);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd0cf);
  SquareMatrix<double,_6>::SquareMatrix(in_RDI);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_01,(uint)((ulong)v >> 0x20),(uint)v,in_RSI);
  SquareMatrix3<double>::transpose(in_stack_fffffffffffff9f8);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_01,(uint)((ulong)v >> 0x20),(uint)v,in_RSI);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd12e);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_01,(uint)((ulong)v >> 0x20),(uint)v,in_RSI);
  RectMatrix<double,6u,6u>::setSubMatrix<OpenMD::SquareMatrix3<double>>
            (this_01,(uint)((ulong)v >> 0x20),(uint)v,in_RSI);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd431);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd43e);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd44b);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd458);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd465);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd472);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd47f);
  return this_00;
}

Assistant:

Mat6x6d HydroProp::getResistanceTensorAtPos(Vector3d pos) {
    // Vector from reference point to center of resistance  = cor_
    // Vector from reference point to new location = pos
    // Vector from center of resistance to new location = pos - cor_
    Vector3d cp = pos - cor_;
    Mat3x3d U;
    U.setupSkewMat(cp);

    Mat3x3d Xitt = getXitt();
    Mat3x3d Xitr = getXitr();
    Mat3x3d Xirr = getXirr();

    Mat3x3d Xipostt;
    Mat3x3d Xiposrr;
    Mat3x3d Xipostr;

    // Resistance tensors at the new location
    Xipostt = Xitt;
    Xipostr = (Xitr - U * Xitt);
    Xiposrr = Xirr - U * Xitt * U + Xitr * U - U * Xitr.transpose();

    Mat6x6d Xipos;
    Xipos.setSubMatrix(0, 0, Xipostt);
    Xipos.setSubMatrix(0, 3, Xipostr.transpose());
    Xipos.setSubMatrix(3, 0, Xipostr);
    Xipos.setSubMatrix(3, 3, Xiposrr);
    return Xipos;
  }